

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O3

ze_result_t
loader::zesVFManagementSetVFTelemetryModeExp
          (zes_vf_handle_t hVFhandle,zes_vf_info_util_exp_flags_t flags,ze_bool_t enable)

{
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hVFhandle + 8) + 0xcf8) != (code *)0x0) {
    zVar1 = (**(code **)(*(long *)(hVFhandle + 8) + 0xcf8))(*(undefined8 *)hVFhandle,flags,enable);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesVFManagementSetVFTelemetryModeExp(
        zes_vf_handle_t hVFhandle,                      ///< [in] Sysman handle for the component.
        zes_vf_info_util_exp_flags_t flags,             ///< [in] utilization flags to enable or disable. May be 0 or a valid
                                                        ///< combination of ::zes_vf_info_util_exp_flag_t.
        ze_bool_t enable                                ///< [in] Enable utilization telemetry.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_vf_object_t*>( hVFhandle )->dditable;
        auto pfnSetVFTelemetryModeExp = dditable->zes.VFManagementExp.pfnSetVFTelemetryModeExp;
        if( nullptr == pfnSetVFTelemetryModeExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hVFhandle = reinterpret_cast<zes_vf_object_t*>( hVFhandle )->handle;

        // forward to device-driver
        result = pfnSetVFTelemetryModeExp( hVFhandle, flags, enable );

        return result;
    }